

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O1

uint32_t helper_sve_pnext_aarch64(void *vd,void *vg,uint32_t pred_desc)

{
  ulong uVar1;
  uint32_t flags;
  uint64_t *puVar2;
  uint64_t *puVar3;
  sbyte sVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t d;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  uVar11 = pred_desc & 0x1f;
  uVar12 = (ulong)uVar11;
  uVar5 = pred_desc >> 10 & 3;
  uVar1 = pred_esz_masks_aarch64[uVar5];
  lVar7 = uVar12 + 1;
  uVar8 = (ulong)(uVar11 << 6);
  puVar2 = pred_esz_masks_aarch64;
  do {
    uVar8 = uVar8 - 0x40;
    uVar10 = *(ulong *)((long)vd + lVar7 * 8 + -0x10) & uVar1;
    uVar9 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    puVar3 = (uint64_t *)((uVar9 ^ 0x3f) + uVar8 ^ 0x3f);
    if (uVar10 == 0) {
      puVar3 = puVar2;
    }
    sVar4 = (sbyte)uVar5;
    if (uVar10 != 0) goto LAB_004969f3;
    lVar7 = lVar7 + -1;
    puVar2 = puVar3;
  } while (1 < lVar7);
  puVar3 = (uint64_t *)(-1L << sVar4);
LAB_004969f3:
  uVar8 = (long)puVar3 + (1L << sVar4);
  if ((long)uVar8 < (long)(ulong)(uVar11 << 6)) {
    uVar10 = -1L << ((byte)uVar8 & 0x3f);
    uVar9 = uVar8 & 0xffffffffffffffc0;
    do {
      uVar6 = *(ulong *)((long)vg + ((long)uVar9 / 0x40) * 8) & uVar1 & uVar10;
      uVar8 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar8 = uVar8 | uVar9;
      uVar9 = uVar9 + 0x40;
    } while ((uVar6 == 0) &&
            (uVar10 = uVar10 | -(ulong)(uVar6 == 0), uVar8 = uVar9,
            (long)uVar9 < (long)(ulong)(uVar11 << 6)));
  }
  flags = 1;
  lVar7 = 0;
  do {
    d = 0;
    if ((long)uVar8 / 0x40 == lVar7) {
      d = 1L << ((byte)uVar8 & 0x3f);
    }
    *(uint64_t *)((long)vd + lVar7 * 8) = d;
    flags = iter_predtest_fwd(d,*(ulong *)((long)vg + lVar7 * 8) & uVar1,flags);
    lVar7 = lVar7 + 1;
  } while (uVar12 + (uVar12 == 0) != lVar7);
  return flags;
}

Assistant:

uint32_t HELPER(sve_pnext)(void *vd, void *vg, uint32_t pred_desc)
{
    intptr_t words = extract32(pred_desc, 0, SIMD_OPRSZ_BITS);
    intptr_t esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    uint32_t flags = PREDTEST_INIT;
    uint64_t *d = vd, *g = vg, esz_mask;
    intptr_t i, next;

    next = last_active_element(vd, words, esz) + (1ULL << esz);
    esz_mask = pred_esz_masks[esz];

    /* Similar to the pseudocode for pnext, but scaled by ESZ
       so that we find the correct bit.  */
    if (next < words * 64) {
        uint64_t mask = -1;

        if (next & 63) {
            mask = ~((1ull << (next & 63)) - 1);
            next &= -64;
        }
        do {
            uint64_t this_g = g[next / 64] & esz_mask & mask;
            if (this_g != 0) {
                next = (next & -64) + ctz64(this_g);
                break;
            }
            next += 64;
            mask = -1;
        } while (next < words * 64);
    }

    i = 0;
    do {
        uint64_t this_d = 0;
        if (i == next / 64) {
            this_d = 1ull << (next & 63);
        }
        d[i] = this_d;
        flags = iter_predtest_fwd(this_d, g[i] & esz_mask, flags);
    } while (++i < words);

    return flags;
}